

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QByteArray * __thiscall QMetaEnumBuilder::key(QMetaEnumBuilder *this,int index)

{
  QMetaEnumBuilderPrivate *pQVar1;
  QByteArray *a;
  qsizetype qVar2;
  int in_EDX;
  QMetaEnumBuilder *in_RDI;
  QMetaEnumBuilderPrivate *d;
  QMetaEnumBuilder *pQVar3;
  
  pQVar3 = in_RDI;
  pQVar1 = d_func(in_RDI);
  if ((pQVar1 != (QMetaEnumBuilderPrivate *)0x0) && (-1 < in_EDX)) {
    a = (QByteArray *)(long)in_EDX;
    qVar2 = QList<QByteArray>::size(&pQVar1->keys);
    if ((long)a < qVar2) {
      QList<QByteArray>::operator[]((QList<QByteArray> *)in_RDI,(qsizetype)a);
      QByteArray::QByteArray((QByteArray *)in_RDI,a);
      return (QByteArray *)pQVar3;
    }
  }
  QByteArray::QByteArray((QByteArray *)0x379ad0);
  return (QByteArray *)pQVar3;
}

Assistant:

QByteArray QMetaEnumBuilder::key(int index) const
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d && index >= 0 && index < d->keys.size())
        return d->keys[index];
    else
        return QByteArray();
}